

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void write_tx_size_vartx(MACROBLOCKD *xd,MB_MODE_INFO *mbmi,TX_SIZE tx_size,int depth,int blk_row,
                        int blk_col,aom_writer *w)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  FRAME_CONTEXT *pFVar8;
  uint uVar9;
  bool bVar10;
  TX_SIZE TVar11;
  int iVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  TX_SIZE TVar17;
  byte *__s;
  int col;
  int iVar18;
  aom_cdf_prob (*paaVar19) [3];
  ulong uVar20;
  
  BVar1 = mbmi->bsize;
  bVar13 = block_size_high[BVar1];
  uVar14 = (uint)bVar13;
  if (xd->mb_to_bottom_edge < 0) {
    uVar14 = (xd->mb_to_bottom_edge >> ((char)xd->plane[0].subsampling_y + 3U & 0x1f)) +
             (uint)bVar13;
  }
  bVar2 = block_size_wide[BVar1];
  uVar15 = (uint)bVar2;
  if (xd->mb_to_right_edge < 0) {
    uVar15 = (xd->mb_to_right_edge >> ((char)xd->plane[0].subsampling_x + 3U & 0x1f)) + (uint)bVar2;
  }
  if ((int)uVar14 >> 2 <= blk_row) {
    return;
  }
  if ((int)uVar15 >> 2 <= blk_col) {
    return;
  }
  __s = xd->above_txfm_context + blk_col;
  uVar20 = (ulong)tx_size;
  if (depth == 2) {
    bVar13 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [txsize_to_bsize[uVar20]];
    uVar14 = tx_size_wide[tx_size];
    memset(xd->left_txfm_context + blk_row,tx_size_high[tx_size],
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[uVar20]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[uVar20]] == 0) & 0xff));
    uVar15 = (uint)bVar13 + (uint)(bVar13 == 0);
    goto LAB_0019e093;
  }
  uVar14 = (uint)*(byte *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
  uVar15 = (uint)*(byte *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
  if (tx_size == '\0') {
    lVar16 = 0;
  }
  else {
    uVar9 = (uint)bVar13;
    if (bVar13 < bVar2) {
      uVar9 = (uint)bVar2;
    }
    bVar13 = 1;
    if (uVar9 < 0x20) {
      if (uVar9 == 8) {
        bVar2 = 0;
        TVar11 = '\x01';
        goto LAB_0019df43;
      }
      if (uVar9 == 0x10) {
        TVar17 = '\x02';
        goto LAB_0019df36;
      }
LAB_0019df4a:
      bVar10 = true;
      TVar17 = '\0';
      bVar13 = 1;
    }
    else {
      TVar17 = '\x04';
      bVar10 = false;
      bVar2 = 1;
      TVar11 = '\x04';
      if (uVar9 == 0x80) {
LAB_0019df43:
        TVar17 = TVar11;
        bVar13 = bVar2;
        bVar10 = false;
      }
      else if (uVar9 != 0x40) {
        if (uVar9 != 0x20) goto LAB_0019df4a;
        TVar17 = '\x03';
LAB_0019df36:
        bVar10 = false;
      }
    }
    lVar16 = 0x3f;
    if (!bVar10) {
      lVar16 = (ulong)(byte)((bVar13 & ""[uVar20] != TVar17) + TVar17 * -2 + 8) * 3;
    }
    lVar16 = (ulong)(xd->left_txfm_context[blk_row] < uVar15) + (ulong)(*__s < uVar14) + lVar16;
  }
  pFVar8 = xd->tile_ctx;
  if (mbmi->inter_tx_size
      [(blk_col >> (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
       ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
       (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))] == tx_size) {
    paaVar19 = pFVar8->txfm_partition_cdf + lVar16;
    od_ec_encode_cdf_q15(&w->ec,0,*paaVar19,2);
    if (w->allow_update_cdf != '\0') {
      uVar3 = pFVar8->txfm_partition_cdf[lVar16][2];
      (*paaVar19)[0] = (*paaVar19)[0] - ((*paaVar19)[0] >> ((char)(uVar3 >> 4) + 4U & 0x1f));
      pFVar8->txfm_partition_cdf[lVar16][2] = uVar3 + (uVar3 < 0x20);
    }
    __s = xd->above_txfm_context + blk_col;
    bVar13 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [txsize_to_bsize[uVar20]];
    memset(xd->left_txfm_context + blk_row,uVar15,
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[uVar20]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[uVar20]] == 0) & 0xff));
    uVar15 = (uint)bVar13 + (uint)(bVar13 == 0);
  }
  else {
    bVar13 = ""[uVar20];
    iVar4 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)bVar13 * 4));
    iVar5 = *(int *)((long)tx_size_high_unit + (ulong)((uint)bVar13 * 4));
    paaVar19 = pFVar8->txfm_partition_cdf + lVar16;
    od_ec_encode_cdf_q15(&w->ec,1,*paaVar19,2);
    if (w->allow_update_cdf != '\0') {
      uVar3 = (*paaVar19)[2];
      (*paaVar19)[0] =
           (short)((int)(0x8000 - (uint)(*paaVar19)[0]) >> ((char)(uVar3 >> 4) + 4U & 0x1f)) +
           (*paaVar19)[0];
      (*paaVar19)[2] = uVar3 + (uVar3 < 0x20);
    }
    if ((99UL >> (uVar20 & 0x3f) & 1) == 0) {
      iVar6 = tx_size_high_unit[tx_size];
      iVar7 = tx_size_wide_unit[tx_size];
      iVar12 = 0;
      do {
        iVar18 = 0;
        do {
          write_tx_size_vartx(xd,mbmi,bVar13,depth + 1,iVar12 + blk_row,blk_col + iVar18,w);
          iVar18 = iVar18 + iVar4;
        } while (iVar18 < iVar7);
        iVar12 = iVar12 + iVar5;
      } while (iVar12 < iVar6);
      return;
    }
    __s = xd->above_txfm_context + blk_col;
    bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
            [txsize_to_bsize[uVar20]];
    uVar14 = tx_size_wide[bVar13];
    memset(xd->left_txfm_context + blk_row,tx_size_high[bVar13],
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[uVar20]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[uVar20]] == 0) & 0xff));
    uVar15 = (uint)bVar2 + (uint)(bVar2 == 0);
  }
LAB_0019e093:
  memset(__s,uVar14,(ulong)(uVar15 & 0xff));
  return;
}

Assistant:

static inline void write_tx_size_vartx(MACROBLOCKD *xd,
                                       const MB_MODE_INFO *mbmi,
                                       TX_SIZE tx_size, int depth, int blk_row,
                                       int blk_col, aom_writer *w) {
  FRAME_CONTEXT *const ec_ctx = xd->tile_ctx;
  const int max_blocks_high = max_block_high(xd, mbmi->bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, mbmi->bsize, 0);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  if (depth == MAX_VARTX_DEPTH) {
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    return;
  }

  const int ctx = txfm_partition_context(xd->above_txfm_context + blk_col,
                                         xd->left_txfm_context + blk_row,
                                         mbmi->bsize, tx_size);
  const int txb_size_index =
      av1_get_txb_size_index(mbmi->bsize, blk_row, blk_col);
  const int write_txfm_partition =
      tx_size == mbmi->inter_tx_size[txb_size_index];
  if (write_txfm_partition) {
    aom_write_symbol(w, 0, ec_ctx->txfm_partition_cdf[ctx], 2);

    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    // TODO(yuec): set correct txfm partition update for qttx
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];

    aom_write_symbol(w, 1, ec_ctx->txfm_partition_cdf[ctx], 2);

    if (sub_txs == TX_4X4) {
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, sub_txs, tx_size);
      return;
    }

    assert(bsw > 0 && bsh > 0);
    for (int row = 0; row < tx_size_high_unit[tx_size]; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < tx_size_wide_unit[tx_size]; col += bsw) {
        const int offsetc = blk_col + col;
        write_tx_size_vartx(xd, mbmi, sub_txs, depth + 1, offsetr, offsetc, w);
      }
    }
  }
}